

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

void os_xlat_html4(uint html4_char,char *result,size_t result_buf_len)

{
  return;
}

Assistant:

void
os_xlat_html4( unsigned int html4_char, char* result, size_t result_buf_len )
{
#ifdef RUNTIME
    // HTML 4 characters are Unicode.  Tads 3 provides just the
    // right mapper: Unicode to ASCII.  We make it static in order
    // not to create a mapper on each call and save CPU cycles.
    static CCharmapToLocalASCII mapper;
    result[mapper.map_char(html4_char, result, result_buf_len)] = '\0';
#else
    (void)html4_char;
    (void)result;
    (void)result_buf_len;
#endif
}